

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiID IVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ImGuiWindow *pIVar7;
  undefined8 uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  ImGuiTabItemFlags IVar12;
  int iVar13;
  int iVar14;
  ImGuiID IVar15;
  ImGuiTabItemFlags IVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ImGuiTabItem *pIVar21;
  ulong uVar22;
  ImGuiTabItem *unaff_R14;
  ImGuiTabItem *pIVar23;
  bool bVar24;
  ImGuiTabItem item_tmp;
  undefined5 uStack_2d;
  undefined3 local_28;
  undefined5 uStack_25;
  undefined3 uStack_20;
  
  IVar2 = tab_bar->ReorderRequestTabId;
  if (IVar2 != 0) {
    uVar19 = (ulong)(tab_bar->Tabs).Size;
    bVar24 = 0 < (long)uVar19;
    if (0 < (long)uVar19) {
      unaff_R14 = (tab_bar->Tabs).Data;
      bVar24 = true;
      if (unaff_R14->ID != IVar2) {
        pIVar21 = unaff_R14 + (uVar19 - 1);
        uVar17 = 1;
        pIVar23 = unaff_R14;
        do {
          uVar22 = uVar17;
          unaff_R14 = pIVar21;
          if (uVar19 == uVar22) break;
          unaff_R14 = pIVar23 + 1;
          pIVar1 = pIVar23 + 1;
          uVar17 = uVar22 + 1;
          pIVar23 = unaff_R14;
        } while (pIVar1->ID != IVar2);
        bVar24 = uVar22 < uVar19;
      }
    }
    if (bVar24) goto LAB_00170eb6;
  }
  unaff_R14 = (ImGuiTabItem *)0x0;
LAB_00170eb6:
  if ((unaff_R14 != (ImGuiTabItem *)0x0) && ((unaff_R14->Flags & 0x20) == 0)) {
    iVar18 = ImGuiTabBar::GetTabOrder(tab_bar,unaff_R14);
    uVar20 = tab_bar->ReorderRequestDir + iVar18;
    if ((-1 < (int)uVar20) && ((int)uVar20 < (tab_bar->Tabs).Size)) {
      pIVar23 = (tab_bar->Tabs).Data;
      uVar3 = pIVar23[uVar20].Flags;
      if (((uVar3 & 0x20) == 0) && (((uVar3 ^ unaff_R14->Flags) & 0xc0) == 0)) {
        pIVar23 = pIVar23 + uVar20;
        IVar15 = unaff_R14->ID;
        IVar16 = unaff_R14->Flags;
        pIVar4 = unaff_R14->Window;
        iVar13 = unaff_R14->LastFrameVisible;
        iVar14 = unaff_R14->LastFrameSelected;
        uVar5._0_4_ = unaff_R14->Offset;
        uVar5._4_4_ = unaff_R14->Width;
        uVar8._0_4_ = unaff_R14->ContentWidth;
        uVar8._4_2_ = unaff_R14->NameOffset;
        uVar8._6_2_ = unaff_R14->BeginOrder;
        uVar6._0_2_ = unaff_R14->IndexDuringLayout;
        uVar6._2_1_ = unaff_R14->WantClose;
        uVar6._3_5_ = *(undefined5 *)&unaff_R14->field_0x2b;
        local_28 = (undefined3)(undefined4)uVar8;
        uStack_25 = (undefined5)((ulong)uVar8 >> 0x18);
        uStack_20 = (undefined3)uVar6;
        uStack_2d = (undefined5)((ulong)uVar5 >> 0x18);
        IVar2 = pIVar23->ID;
        IVar12 = pIVar23->Flags;
        pIVar7 = pIVar23->Window;
        iVar18 = pIVar23->LastFrameVisible;
        iVar9 = pIVar23->LastFrameSelected;
        fVar10 = pIVar23->Offset;
        fVar11 = pIVar23->Width;
        uVar8 = *(undefined8 *)((long)&pIVar23->ContentWidth + 3);
        *(undefined8 *)((long)&unaff_R14->Offset + 3) = *(undefined8 *)((long)&pIVar23->Offset + 3);
        *(undefined8 *)((long)&unaff_R14->ContentWidth + 3) = uVar8;
        unaff_R14->LastFrameVisible = iVar18;
        unaff_R14->LastFrameSelected = iVar9;
        unaff_R14->Offset = fVar10;
        unaff_R14->Width = fVar11;
        unaff_R14->ID = IVar2;
        unaff_R14->Flags = IVar12;
        unaff_R14->Window = pIVar7;
        *(ulong *)((long)&pIVar23->Offset + 3) = CONCAT35(local_28,uStack_2d);
        *(ulong *)((long)&pIVar23->ContentWidth + 3) = CONCAT35(uStack_20,uStack_25);
        pIVar23->LastFrameVisible = iVar13;
        pIVar23->LastFrameSelected = iVar14;
        pIVar23->Offset = (float)(undefined4)uVar5;
        pIVar23->Width = (float)uVar5._4_4_;
        pIVar23->ID = IVar15;
        pIVar23->Flags = IVar16;
        pIVar23->Window = pIVar4;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}